

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

State * __thiscall re2::DFA::WorkqToCachedState(DFA *this,Workq *q,Workq *mq,uint32_t flag)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  InstOp IVar6;
  EmptyOp EVar7;
  ulong uVar8;
  int *piVar9;
  Prog *this_00;
  Prog *pPVar10;
  Prog *pPVar11;
  Inst *pIVar12;
  int *piVar13;
  iterator piVar14;
  uint in_ECX;
  long in_RDX;
  Workq *in_RSI;
  undefined8 *in_RDI;
  State *state;
  Inst *ip_3;
  int id_1;
  iterator i;
  int *ep_1;
  int *ip_2;
  int *markp;
  int *ep;
  int *ip_1;
  Inst *ip;
  int id;
  iterator it;
  bool sawmark;
  bool sawmatch;
  uint32_t needflags;
  int n;
  int *inst;
  int in_stack_ffffffffffffff1c;
  Prog *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  iterator piVar15;
  uint7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  Prog *p;
  iterator local_88;
  int *local_70;
  int *local_60;
  Inst *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  EmptyOp local_38;
  int local_34;
  uint local_24;
  State *local_8;
  
  iVar5 = Workq::size(in_RSI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar5;
  uVar8 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  piVar9 = (int *)operator_new__(uVar8);
  local_34 = 0;
  local_38 = 0;
  bVar2 = false;
  bVar3 = false;
  this_00 = (Prog *)SparseSetT<void>::begin((SparseSetT<void> *)0x23e29e);
  do {
    p = this_00;
    pPVar10 = (Prog *)SparseSetT<void>::end((SparseSetT<void> *)in_stack_ffffffffffffff20);
    if ((this_00 == pPVar10) ||
       ((in_stack_ffffffffffffffb4._0_1_ = p->anchor_start_,
        in_stack_ffffffffffffffb4._1_1_ = p->anchor_end_,
        in_stack_ffffffffffffffb4._2_1_ = p->reversed_,
        in_stack_ffffffffffffffb4._3_1_ = p->did_flatten_, bVar2 &&
        ((*(int *)(in_RDI + 1) == 0 ||
         (bVar4 = Workq::is_mark(in_RSI,in_stack_ffffffffffffffb4), bVar4)))))) {
      if ((0 < local_34) && (piVar9[local_34 + -1] == -1)) {
        local_34 = local_34 + -1;
      }
      local_24 = in_ECX;
      if (local_38 == 0) {
        local_24 = in_ECX & 0x100;
      }
      if ((local_34 == 0) && (local_24 == 0)) {
        if (piVar9 != (int *)0x0) {
          operator_delete__(piVar9);
        }
        local_8 = (State *)0x1;
      }
      else {
        if (*(int *)(in_RDI + 1) == 1) {
          piVar13 = piVar9 + local_34;
          local_60 = piVar9;
          while (local_60 < piVar13) {
            local_70 = local_60;
            while( true ) {
              in_stack_ffffffffffffff37 = false;
              if (local_70 < piVar13) {
                in_stack_ffffffffffffff37 = *local_70 != -1;
              }
              if ((bool)in_stack_ffffffffffffff37 == false) break;
              local_70 = local_70 + 1;
            }
            std::sort<int*>((int *)(ulong)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
            if (local_70 < piVar13) {
              local_70 = local_70 + 1;
            }
            local_60 = local_70;
          }
        }
        if (*(int *)(in_RDI + 1) == 3) {
          std::sort<int*>((int *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff28);
        }
        if (in_RDX != 0) {
          piVar9[local_34] = -2;
          local_88 = SparseSetT<void>::begin((SparseSetT<void> *)0x23e72b);
          local_34 = local_34 + 1;
          while (piVar15 = local_88,
                piVar14 = SparseSetT<void>::end((SparseSetT<void> *)in_stack_ffffffffffffff20),
                piVar15 != piVar14) {
            pIVar12 = Prog::inst(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
            IVar6 = Prog::Inst::opcode(pIVar12);
            if (IVar6 == kInstMatch) {
              iVar5 = Prog::Inst::match_id(pIVar12);
              piVar9[local_34] = iVar5;
              local_34 = local_34 + 1;
            }
            local_88 = local_88 + 1;
          }
        }
        local_8 = CachedState((DFA *)p,(int *)CONCAT44(in_stack_ffffffffffffffb4,
                                                       in_stack_ffffffffffffffb0),
                              (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                              (uint32_t)in_stack_ffffffffffffffa8);
        if (piVar9 != (int *)0x0) {
          operator_delete__(piVar9);
        }
      }
      return local_8;
    }
    bVar4 = Workq::is_mark(in_RSI,in_stack_ffffffffffffffb4);
    if (bVar4) {
      if ((0 < local_34) && (piVar9[local_34 + -1] != -1)) {
        bVar3 = true;
        piVar9[local_34] = -1;
        local_34 = local_34 + 1;
      }
    }
    else {
      in_stack_ffffffffffffffa8 = Prog::inst(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      IVar6 = Prog::Inst::opcode(in_stack_ffffffffffffffa8);
      pPVar10 = p;
      if (((((IVar6 == kInstAltMatch) && (*(int *)(in_RDI + 1) != 3)) &&
           ((*(int *)(in_RDI + 1) != 0 ||
            ((pPVar11 = (Prog *)SparseSetT<void>::begin((SparseSetT<void> *)0x23e3ef), p == pPVar11
             && (bVar4 = Prog::Inst::greedy((Inst *)this_00,p), bVar4)))))) &&
          ((*(int *)(in_RDI + 1) != 1 || (!bVar3)))) && ((in_ECX & 0x100) != 0)) {
        if (piVar9 != (int *)0x0) {
          operator_delete__(piVar9);
        }
        return (State *)0x2;
      }
      p = pPVar10;
      pIVar12 = Prog::inst(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      iVar5 = Prog::Inst::last(pIVar12);
      if (iVar5 != 0) {
        piVar9[local_34] = *(int *)p;
        local_34 = local_34 + 1;
      }
      IVar6 = Prog::Inst::opcode(in_stack_ffffffffffffffa8);
      if (IVar6 == kInstEmptyWidth) {
        EVar7 = Prog::Inst::empty(in_stack_ffffffffffffffa8);
        local_38 = EVar7 | local_38;
      }
      IVar6 = Prog::Inst::opcode(in_stack_ffffffffffffffa8);
      if ((IVar6 == kInstMatch) && (bVar4 = Prog::anchor_end((Prog *)*in_RDI), !bVar4)) {
        bVar2 = true;
      }
    }
    this_00 = (Prog *)&p->did_onepass_;
  } while( true );
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, Workq* mq, uint32_t flag) {
  //mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  int* inst = new int[q->size()];
  int n = 0;
  uint32_t needflags = 0;  // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;   // whether queue contains guaranteed kInstMatch
  bool sawmark = false;    // whether queue contains a Mark
  if (ExtraDebug)
    fprintf(stderr, "WorkqToCachedState %s [%#x]", DumpWorkq(q).c_str(), flag);
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          delete[] inst;
          if (ExtraDebug)
            fprintf(stderr, " -> FullMatchState\n");
          return FullMatchState;
        }
        FALLTHROUGH_INTENDED;
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    delete[] inst;
    if (ExtraDebug)
      fprintf(stderr, " -> DeadState\n");
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst;
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      std::sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // If we're in many match mode, canonicalize for similar reasons:
  // we have an unordered set of states (i.e. we don't have Marks)
  // and sorting will reduce the number of distinct sets stored.
  if (kind_ == Prog::kManyMatch) {
    int* ip = inst;
    int* ep = ip + n;
    std::sort(ip, ep);
  }

  // Append MatchSep and the match IDs in mq if necessary.
  if (mq != NULL) {
    inst[n++] = MatchSep;
    for (Workq::iterator i = mq->begin(); i != mq->end(); ++i) {
      int id = *i;
      Prog::Inst* ip = prog_->inst(id);
      if (ip->opcode() == kInstMatch)
        inst[n++] = ip->match_id();
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst, n, flag);
  delete[] inst;
  return state;
}